

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

uint32 add_ctab_bytes(Context_conflict2 *ctx,uint8 *bytes,size_t len)

{
  ssize_t sVar1;
  size_t sVar2;
  int iVar3;
  uint32 uVar4;
  
  uVar4 = 0;
  if (ctx->isfail == 0) {
    sVar1 = buffer_find(ctx->ctab,0x20,bytes,len);
    iVar3 = (int)sVar1;
    if (sVar1 < 0) {
      sVar2 = buffer_size(ctx->ctab);
      iVar3 = (int)sVar2;
      buffer_append(ctx->ctab,bytes,len);
    }
    uVar4 = iVar3 - 4;
  }
  return uVar4;
}

Assistant:

static uint32 add_ctab_bytes(Context *ctx, const uint8 *bytes, const size_t len)
{
    if (isfail(ctx))
        return 0;

    const size_t extra = CTAB_SIZE + sizeof (uint32);
    const ssize_t pos = buffer_find(ctx->ctab, extra, bytes, len);
    if (pos >= 0)  // blob is already in here.
        return ((uint32) pos) - sizeof (uint32);

    // add it to the byte pile...
    const uint32 retval = ((uint32) buffer_size(ctx->ctab)) - sizeof (uint32);
    buffer_append(ctx->ctab, bytes, len);
    return retval;
}